

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O3

void __thiscall MyAudioDescriptor::MyDump(MyAudioDescriptor *this,FILE *stream)

{
  list<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
  *plVar1;
  WaveAudioDescriptor *pWVar2;
  _List_node_base *p_Var3;
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  pWVar2 = this->m_WaveAudioDescriptor;
  if (pWVar2 != (WaveAudioDescriptor *)0x0) {
    (**(code **)(*(long *)pWVar2 + 0x88))(pWVar2,stream);
  }
  plVar1 = &this->m_ChannelDescriptorList;
  if ((this->m_ChannelDescriptorList).
      super__List_base<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)plVar1) {
    fwrite("Audio Channel Subdescriptors:\n",0x1e,1,(FILE *)stream);
    for (p_Var3 = (plVar1->
                  super__List_base<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)plVar1; p_Var3 = p_Var3->_M_next) {
      (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x88))(p_Var3[1]._M_next,stream);
    }
  }
  return;
}

Assistant:

void MyDump(FILE* stream) {
    if ( stream == 0 )
      {
	stream = stderr;
      }

    if ( m_WaveAudioDescriptor != 0 )
      {
	m_WaveAudioDescriptor->Dump(stream);
      }

    if ( ! m_ChannelDescriptorList.empty() )
      {
	fprintf(stream, "Audio Channel Subdescriptors:\n");

	std::list<MCALabelSubDescriptor*>::const_iterator i = m_ChannelDescriptorList.begin();
	for ( ; i != m_ChannelDescriptorList.end(); ++i )
	  {
	    (**i).Dump(stream);
	  }
      }
  }